

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall
slang::ast::Statement::StatementContext::observeTiming(StatementContext *this,TimingControl *timing)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange range;
  bool bVar1;
  bitmask<slang::ast::StatementFlags> *r;
  TimingControl *in_RSI;
  long in_RDI;
  Diagnostic *diag;
  ProceduralBlockSymbol *proc;
  ASTContext *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte bVar2;
  bitmask<slang::ast::StatementFlags> local_7c;
  ASTContext *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  DiagCode DVar3;
  bitmask<slang::ast::StatementFlags> local_3c;
  SourceLocation local_38;
  SourceLocation local_30;
  SourceLocation local_28;
  undefined4 local_1c;
  ProceduralBlockSymbol *local_18;
  TimingControl *local_10;
  
  DVar3 = SUB84((ulong)in_stack_ffffffffffffffa0 >> 0x20,0);
  local_10 = in_RSI;
  local_18 = ASTContext::getProceduralBlock(in_stack_ffffffffffffff68);
  if (((local_18 != (ProceduralBlockSymbol *)0x0) && (local_18->procedureKind == AlwaysFF)) &&
     (bVar1 = TimingControl::bad(local_10), !bVar1)) {
    if (((local_10->kind == SignalEvent) || (local_10->kind == EventList)) ||
       (local_10->kind == ImplicitEvent)) {
      local_38 = SourceRange::start((SourceRange *)(in_RDI + 0x18));
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x12d887f);
      bVar2 = 0;
      if (bVar1) {
        r = (bitmask<slang::ast::StatementFlags> *)(in_RDI + 0x10);
        bitmask<slang::ast::StatementFlags>::bitmask(&local_3c,HasTimingError);
        bVar1 = bitmask<slang::ast::StatementFlags>::has
                          ((bitmask<slang::ast::StatementFlags> *)
                           CONCAT17(bVar2,in_stack_ffffffffffffff70),r);
        bVar2 = bVar1 ^ 0xff;
      }
      if ((bVar2 & 1) != 0) {
        DVar3 = SUB84((local_10->sourceRange).startLoc,4);
        sourceRange_00.endLoc._0_4_ = in_stack_ffffffffffffff98;
        sourceRange_00.startLoc = (SourceLocation)in_stack_ffffffffffffff90;
        sourceRange_00.endLoc._4_4_ = in_stack_ffffffffffffff9c;
        ASTContext::addDiag(in_stack_ffffffffffffff88,DVar3,sourceRange_00);
        range.endLoc._0_4_ = in_stack_ffffffffffffff98;
        range.startLoc = (SourceLocation)*(undefined8 *)(in_RDI + 0x20);
        range.endLoc._4_4_ = 0xc0001;
        Diagnostic::addNote(*(Diagnostic **)(in_RDI + 0x18),DVar3,range);
        bitmask<slang::ast::StatementFlags>::bitmask(&local_7c,HasTimingError);
        bitmask<slang::ast::StatementFlags>::operator|=
                  ((bitmask<slang::ast::StatementFlags> *)(in_RDI + 0x10),&local_7c);
      }
      *(SourceLocation *)(in_RDI + 0x18) = (local_10->sourceRange).startLoc;
      *(SourceLocation *)(in_RDI + 0x20) = (local_10->sourceRange).endLoc;
    }
    else {
      local_1c = 0x70008;
      local_30 = (local_10->sourceRange).startLoc;
      local_28 = (local_10->sourceRange).endLoc;
      sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff98;
      sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff90;
      sourceRange.endLoc._4_4_ = in_stack_ffffffffffffff9c;
      ASTContext::addDiag(in_stack_ffffffffffffff88,DVar3,sourceRange);
    }
  }
  return;
}

Assistant:

void Statement::StatementContext::observeTiming(const TimingControl& timing) {
    auto proc = rootAstContext.getProceduralBlock();
    if (!proc || proc->procedureKind != ProceduralBlockKind::AlwaysFF || timing.bad())
        return;

    if (timing.kind != TimingControlKind::SignalEvent &&
        timing.kind != TimingControlKind::EventList &&
        timing.kind != TimingControlKind::ImplicitEvent) {
        rootAstContext.addDiag(diag::BlockingInAlwaysFF, timing.sourceRange);
        return;
    }

    if (lastEventControl.start() && !flags.has(StatementFlags::HasTimingError)) {
        auto& diag = rootAstContext.addDiag(diag::AlwaysFFEventControl, timing.sourceRange);
        diag.addNote(diag::NotePreviousUsage, lastEventControl);

        flags |= StatementFlags::HasTimingError;
    }

    lastEventControl = timing.sourceRange;
}